

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser.cpp
# Opt level: O0

void __thiscall QHttpHeaderParser::clear(QHttpHeaderParser *this)

{
  QString *in_RDI;
  
  *(undefined4 *)&in_RDI[1].d.ptr = 100;
  *(undefined4 *)((long)&in_RDI[1].d.ptr + 4) = 0;
  *(undefined4 *)&in_RDI[1].d.size = 0;
  QString::clear(in_RDI);
  QHttpHeaders::clear((QHttpHeaders *)in_RDI);
  return;
}

Assistant:

void QHttpHeaderParser::clear()
{
    statusCode = 100;
    majorVersion = 0;
    minorVersion = 0;
    reasonPhrase.clear();
    fields.clear();
}